

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_commands.cpp
# Opt level: O2

void set_command_from_button(Am_Object *parent_command,Am_Object *button)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Value value;
  
  value.type = 2;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  bVar1 = Am_Object::Valid(button);
  if (bVar1) {
    in_value = Am_Object::Get(button,0x1af,1);
    Am_Value::operator=(&value,in_value);
  }
  Am_Object::Set(parent_command,0x169,&value,0);
  Am_Value::~Am_Value(&value);
  return;
}

Assistant:

void
set_command_from_button(Am_Object parent_command, Am_Object button)
{
  Am_Value value = 0;
  if (button.Valid())
    value = button.Peek(Am_LABEL_OR_ID);
  parent_command.Set(Am_VALUE, value);
}